

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_statemach_act(connectdata *conn)

{
  anon_union_264_9_0449b319_for_proto *pp;
  uint *puVar1;
  imapstate iVar2;
  curl_usessl cVar3;
  void *pvVar4;
  SessionHandle *pSVar5;
  connectdata *pcVar6;
  int iVar7;
  _Bool _Var8;
  CURLcode CVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  curl_socket_t sockfd;
  long lVar14;
  long lVar15;
  char *pcVar16;
  SessionHandle *pSVar17;
  SessionHandle *pSVar18;
  long lVar19;
  char *chlg64_1;
  size_t len;
  size_t len_1;
  curl_socket_t local_60;
  smtpstate local_5c;
  SessionHandle *local_58;
  SessionHandle *local_50;
  smtpstate state1;
  int smtpcode;
  size_t nread;
  
  sockfd = conn->sock[0];
  pSVar18 = conn->data;
  nread = 0;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE_PLAIN) {
LAB_0044277f:
    CVar9 = CURLE_NOT_BUILT_IN;
  }
  else {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar9;
    }
    do {
      CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&smtpcode,&nread);
      iVar7 = smtpcode;
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      iVar2 = (conn->proto).imapc.state;
      if (smtpcode != 1 && iVar2 != IMAP_APPEND_FINAL) {
        (pSVar18->info).httpcode = smtpcode;
      }
      if (smtpcode == 0) {
        return CURLE_OK;
      }
      switch(iVar2) {
      case IMAP_SERVERGREET:
        if (99 < smtpcode - 200U) {
          Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)(uint)smtpcode);
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        (conn->proto).ftpc.dirdepth = 0;
        (conn->proto).imapc.cmdid = 0;
        (conn->proto).imapc.resptag[0] = '\0';
        (conn->proto).imapc.resptag[2] = '\0';
        CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"EHLO %s",(conn->proto).ftpc.dirs);
        iVar2 = IMAP_CAPABILITY;
        goto LAB_00442c1b;
      case IMAP_CAPABILITY:
        pSVar17 = conn->data;
        if (smtpcode - 300U < 0xffffff9c && smtpcode != 1) {
          if ((CURLUSESSL_TRY < (pSVar17->set).use_ssl) && (conn->ssl[0].use != true))
          goto LAB_00443306;
          (conn->proto).imapc.cmdid = 0;
          CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.dirs);
          iVar2 = IMAP_STARTTLS;
          goto LAB_00442c1b;
        }
        local_50 = pSVar18;
        sVar11 = strlen((pSVar17->state).buffer);
        pcVar16 = (pSVar17->state).buffer + 4;
        uVar12 = sVar11 - 4;
        local_58 = pSVar17;
        if (uVar12 < 8) {
          if (3 < uVar12) goto LAB_00442ed3;
        }
        else if (*(long *)pcVar16 == 0x534c545452415453) {
          (conn->proto).imapc.resptag[0] = '\x01';
        }
        else {
LAB_00442ed3:
          if (*(int *)pcVar16 == 0x455a4953) {
            (conn->proto).imapc.resptag[1] = '\x01';
          }
          else if ((4 < uVar12) && (iVar10 = bcmp(pcVar16,"AUTH ",5), iVar10 == 0)) {
            (conn->proto).imapc.resptag[2] = '\x01';
            pcVar16 = (local_58->state).buffer + 9;
            lVar19 = sVar11 - 9;
            local_60 = sockfd;
            while (lVar19 != 0) {
              if (((ulong)(byte)*pcVar16 < 0x21) &&
                 ((0x100002600U >> ((ulong)(byte)*pcVar16 & 0x3f) & 1) != 0)) {
                pcVar16 = pcVar16 + 1;
                lVar19 = lVar19 + -1;
              }
              else {
                lVar14 = 0;
                while ((lVar15 = lVar19, lVar19 != lVar14 &&
                       ((0x20 < (ulong)(byte)pcVar16[lVar14] ||
                        (lVar15 = lVar14,
                        (0x100002600U >> ((ulong)(byte)pcVar16[lVar14] & 0x3f) & 1) == 0))))) {
                  lVar14 = lVar14 + 1;
                }
                switch(lVar15) {
                case 4:
                  uVar13 = 0x40;
                  if (*(int *)pcVar16 != 0x4d4c544e) break;
                  goto LAB_0044306c;
                case 5:
                  iVar10 = bcmp(pcVar16,"LOGIN",5);
                  uVar13 = 1;
                  if (iVar10 == 0) goto LAB_0044306c;
                  iVar10 = bcmp(pcVar16,"PLAIN",5);
                  uVar13 = 2;
                  goto LAB_0044301a;
                case 6:
                  iVar10 = bcmp(pcVar16,"GSSAPI",6);
                  uVar13 = 0x10;
                  goto LAB_0044301a;
                case 7:
                  iVar10 = bcmp(pcVar16,"XOAUTH2",7);
                  if (iVar10 == 0) {
                    uVar13 = 0x80;
                    goto LAB_0044306c;
                  }
                  break;
                case 8:
                  uVar13 = 4;
                  if ((*(long *)pcVar16 == 0x35444d2d4d415243) ||
                     (uVar13 = 0x20, *(long *)pcVar16 == 0x4c414e5245545845)) goto LAB_0044306c;
                  break;
                case 10:
                  iVar10 = bcmp(pcVar16,"DIGEST-MD5",10);
                  uVar13 = 8;
LAB_0044301a:
                  if (iVar10 == 0) {
LAB_0044306c:
                    puVar1 = &(conn->proto).imapc.prefmech;
                    *puVar1 = *puVar1 | uVar13;
                  }
                }
                pcVar16 = pcVar16 + lVar15;
                lVar19 = lVar19 - lVar15;
                sockfd = local_60;
              }
            }
          }
        }
        pSVar18 = local_50;
        if (iVar7 != 1) {
          cVar3 = (local_58->set).use_ssl;
          if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).imapc.resptag[0] == '\x01') {
              CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STARTTLS");
              iVar2 = IMAP_UPGRADETLS;
              goto LAB_00442c1b;
            }
            if (cVar3 != CURLUSESSL_TRY) {
              Curl_failf(local_58,"STARTTLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
          CVar9 = smtp_perform_authentication(conn);
          break;
        }
        goto LAB_00442d82;
      case IMAP_STARTTLS:
        if (99 < smtpcode - 200U) {
          pSVar17 = conn->data;
LAB_00443306:
          Curl_failf(pSVar17,"Remote access denied: %d",(ulong)(uint)smtpcode);
          return CURLE_REMOTE_ACCESS_DENIED;
        }
        goto switchD_0044282e_caseD_5;
      case IMAP_UPGRADETLS:
        if (smtpcode == 0xdc) goto LAB_0044277f;
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)smtpcode);
          return CURLE_USE_SSL_FAILED;
        }
        CVar9 = smtp_perform_authentication(conn);
        break;
      default:
        goto switchD_0044282e_caseD_5;
      case IMAP_AUTHENTICATE_LOGIN:
        pSVar17 = conn->data;
        len = 0;
        chlg64_1 = (char *)0x0;
        if (smtpcode == 0x14e) {
          CVar9 = Curl_sasl_create_plain_message(pSVar17,conn->user,conn->passwd,&chlg64_1,&len);
          goto LAB_00442c65;
        }
LAB_00442cab:
        len = 0;
        chlg64_1 = (char *)0x0;
        Curl_failf(pSVar17,"Access denied: %d",(ulong)(uint)smtpcode);
        CVar9 = CURLE_LOGIN_DENIED;
        goto LAB_00442cd1;
      case IMAP_AUTHENTICATE_LOGIN_PASSWD:
        pSVar17 = conn->data;
        len = 0;
        chlg64_1 = (char *)0x0;
        if (smtpcode != 0x14e) goto LAB_00442cab;
        CVar9 = Curl_sasl_create_login_message(pSVar17,conn->user,&chlg64_1,&len);
        if ((chlg64_1 == (char *)0x0 || CVar9 != CURLE_OK) ||
           (CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar9 != CURLE_OK)) goto LAB_00442cd1;
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_CRAMMD5;
        goto LAB_00442ca6;
      case IMAP_AUTHENTICATE_CRAMMD5:
        pSVar17 = conn->data;
        len = 0;
        chlg64_1 = (char *)0x0;
        if (smtpcode != 0x14e) goto LAB_00442cab;
        CVar9 = Curl_sasl_create_login_message(pSVar17,conn->passwd,&chlg64_1,&len);
        goto LAB_00442c65;
      case IMAP_AUTHENTICATE_DIGESTMD5:
        pSVar17 = conn->data;
        len = 0;
        chlg64_1 = (char *)0x0;
        len_1 = 0;
        _state1 = 0;
        if (smtpcode == 0x14e) {
          smtp_get_message((pSVar17->state).buffer,&chlg64_1);
          CVar9 = Curl_sasl_decode_cram_md5_message(chlg64_1,(char **)&len,(size_t *)&state1);
          if (CVar9 == CURLE_OK) {
            CVar9 = Curl_sasl_create_cram_md5_message
                              (pSVar17,(char *)len,conn->user,conn->passwd,(char **)&len_1,
                               (size_t *)&state1);
            if (len_1 != 0 && CVar9 == CURLE_OK) {
              CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s");
              iVar2 = IMAP_LOGIN;
              goto LAB_004430d9;
            }
          }
          else {
            CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
            iVar2 = IMAP_AUTHENTICATE_FINAL;
LAB_004430d9:
            if (CVar9 == CURLE_OK) {
              (conn->proto).imapc.state = iVar2;
              CVar9 = CURLE_OK;
            }
          }
          pcVar16 = (char *)len_1;
          if (len != 0) {
            (*Curl_cfree)((void *)len);
            len = 0;
            pcVar16 = (char *)len_1;
          }
          goto LAB_0044313c;
        }
LAB_00442b4b:
        len_1 = 0;
        len = 0;
        chlg64_1 = (char *)0x0;
        Curl_failf(pSVar17,"Access denied: %d",(ulong)(uint)smtpcode);
        CVar9 = CURLE_LOGIN_DENIED;
        break;
      case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
        pSVar17 = conn->data;
        len = 0;
        chlg64_1 = (char *)0x0;
        len_1 = 0;
        if (smtpcode != 0x14e) goto LAB_00442b4b;
        smtp_get_message((pSVar17->state).buffer,(char **)&len);
        CVar9 = Curl_sasl_create_digest_md5_message
                          (pSVar17,(char *)len,conn->user,conn->passwd,"smtp",&chlg64_1,&len_1);
        if (CVar9 == CURLE_OK) {
          CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",chlg64_1);
          iVar2 = IMAP_AUTHENTICATE_NTLM;
LAB_00443128:
          pcVar16 = chlg64_1;
          if (CVar9 == CURLE_OK) {
            (conn->proto).imapc.state = iVar2;
            CVar9 = CURLE_OK;
          }
        }
        else {
          pcVar16 = chlg64_1;
          if (CVar9 == CURLE_BAD_CONTENT_ENCODING) {
            CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
            iVar2 = IMAP_AUTHENTICATE_FINAL;
            goto LAB_00443128;
          }
        }
LAB_0044313c:
        if (pcVar16 == (char *)0x0) break;
        goto LAB_00442cdd;
      case IMAP_AUTHENTICATE_NTLM:
        if (smtpcode != 0x14e) {
LAB_00443201:
          Curl_failf(conn->data,"Authentication failed: %d",(ulong)(uint)smtpcode);
          return CURLE_LOGIN_DENIED;
        }
        CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","");
        iVar2 = IMAP_LOGIN;
        goto LAB_00442c1b;
      case IMAP_AUTHENTICATE_CANCEL:
        pSVar17 = conn->data;
        len = 0;
        chlg64_1 = (char *)0x0;
        if (smtpcode != 0x14e) goto LAB_00442cab;
        CVar9 = Curl_sasl_create_xoauth2_message
                          (pSVar17,conn->user,conn->xoauth2_bearer,&chlg64_1,&len);
LAB_00442c65:
        if ((chlg64_1 != (char *)0x0 && CVar9 == CURLE_OK) &&
           (CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar9 == CURLE_OK)) {
          (conn->proto).imapc.state = IMAP_LOGIN;
LAB_00442ca6:
          CVar9 = CURLE_OK;
        }
LAB_00442cd1:
        pcVar16 = chlg64_1;
        if (chlg64_1 != (char *)0x0) {
LAB_00442cdd:
          (*Curl_cfree)(pcVar16);
        }
        break;
      case IMAP_AUTHENTICATE_FINAL:
        pSVar17 = conn->data;
        len = 0;
        chlg64_1 = (char *)0x0;
        len_1 = 0;
        _state1 = _state1 & 0xffffffff00000000;
        local_5c = SMTP_STOP;
        puVar1 = &(conn->proto).imapc.prefmech;
        *puVar1 = *puVar1 ^ (conn->proto).pop3c.authtypes;
        CVar9 = smtp_calc_sasl_details(conn,(char **)&len,&chlg64_1,&len_1,&state1,&local_5c);
        if (CVar9 == CURLE_OK) {
          if (len == 0) {
            Curl_failf(pSVar17,"Authentication cancelled");
            CVar9 = CURLE_LOGIN_DENIED;
          }
          else {
            CVar9 = smtp_perform_auth(conn,(char *)len,chlg64_1,len_1,state1,local_5c);
            if (chlg64_1 != (char *)0x0) {
              (*Curl_cfree)(chlg64_1);
            }
          }
        }
        break;
      case IMAP_LOGIN:
        if (smtpcode != 0xeb) goto LAB_00443201;
        goto switchD_0044282e_caseD_5;
      case IMAP_LIST:
        pSVar17 = conn->data;
        pSVar5 = (SessionHandle *)(pSVar17->req).protop;
        pcVar16 = (pSVar17->state).buffer;
        local_60 = sockfd;
        local_50 = pSVar18;
        sVar11 = strlen(pcVar16);
        local_58 = pSVar5;
        if ((iVar7 - 300U < 0xffffff9c) && (pSVar5->easy_conn != (connectdata *)0x0)) {
          if ((iVar7 != 1) && (iVar7 != 0x229)) {
LAB_004432bd:
            Curl_failf(pSVar17,"Command failed: %d",(ulong)(uint)iVar7);
            return CURLE_RECV_ERROR;
          }
        }
        else if ((iVar7 - 300U < 0xffffff9c) &&
                ((iVar7 != 1 && (pSVar5->easy_conn == (connectdata *)0x0)))) goto LAB_004432bd;
        CVar9 = CURLE_OK;
        if ((pSVar17->set).opt_no_body == false) {
          pcVar16[sVar11] = '\n';
          CVar9 = Curl_client_write(conn,1,pcVar16,sVar11 + 1);
          pcVar16[sVar11] = '\0';
        }
        pSVar18 = local_50;
        sockfd = local_60;
        if (iVar7 != 1) {
          if ((local_58->easy_conn == (connectdata *)0x0) ||
             (pcVar6 = *(connectdata **)(local_58->easy_conn->chunk).hexbuffer,
             local_58->easy_conn = pcVar6, pcVar6 == (connectdata *)0x0)) {
            (conn->proto).imapc.state = IMAP_STOP;
          }
          else {
            CVar9 = smtp_perform_command(conn);
          }
        }
        break;
      case IMAP_SELECT:
        if (99 < smtpcode - 200U) {
          pSVar17 = conn->data;
          pcVar16 = "MAIL failed: %d";
LAB_004432df:
          Curl_failf(pSVar17,pcVar16,(ulong)(uint)smtpcode);
          return CURLE_SEND_ERROR;
        }
LAB_00442d5c:
        CVar9 = smtp_perform_rcpt_to(conn);
        break;
      case IMAP_FETCH:
        pSVar17 = conn->data;
        if (99 < smtpcode - 200U) {
          pcVar16 = "RCPT failed: %d";
          goto LAB_004432df;
        }
        pvVar4 = (pSVar17->req).protop;
        lVar19 = *(long *)(*(long *)((long)pvVar4 + 0x10) + 8);
        *(long *)((long)pvVar4 + 0x10) = lVar19;
        if (lVar19 != 0) goto LAB_00442d5c;
        CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","DATA");
        iVar2 = IMAP_FETCH_FINAL;
LAB_00442c1b:
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        (conn->proto).imapc.state = iVar2;
        goto LAB_00442d82;
      case IMAP_FETCH_FINAL:
        pSVar17 = conn->data;
        if (smtpcode != 0x162) {
          pcVar16 = "DATA failed: %d";
          goto LAB_004432df;
        }
        Curl_pgrsSetUploadSize(pSVar17,(pSVar17->state).infilesize);
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
switchD_0044282e_caseD_5:
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      case IMAP_APPEND:
        (conn->proto).imapc.state = IMAP_STOP;
        if (smtpcode != 0xfa) {
          return CURLE_RECV_ERROR;
        }
        return CURLE_OK;
      }
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
LAB_00442d82:
      _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
      CVar9 = CURLE_OK;
    } while (_Var8);
  }
  return CVar9;
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct SessionHandle *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_PLAIN:
      result = smtp_state_auth_plain_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_LOGIN:
      result = smtp_state_auth_login_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_LOGIN_PASSWD:
      result = smtp_state_auth_login_password_resp(conn, smtpcode,
                                                   smtpc->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case SMTP_AUTH_CRAMMD5:
      result = smtp_state_auth_cram_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_DIGESTMD5:
      result = smtp_state_auth_digest_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_DIGESTMD5_RESP:
      result = smtp_state_auth_digest_resp_resp(conn, smtpcode, smtpc->state);
      break;
#endif

#ifdef USE_NTLM
    case SMTP_AUTH_NTLM:
      result = smtp_state_auth_ntlm_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_NTLM_TYPE2MSG:
      result = smtp_state_auth_ntlm_type2msg_resp(conn, smtpcode,
                                                  smtpc->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case SMTP_AUTH_GSSAPI:
      result = smtp_state_auth_gssapi_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_GSSAPI_TOKEN:
      result = smtp_state_auth_gssapi_token_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_GSSAPI_NO_DATA:
      result = smtp_state_auth_gssapi_no_data_resp(conn, smtpcode,
                                                   smtpc->state);
      break;
#endif

    case SMTP_AUTH_XOAUTH2:
      result = smtp_state_auth_xoauth2_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_CANCEL:
      result = smtp_state_auth_cancel_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_FINAL:
      result = smtp_state_auth_final_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}